

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O2

bool __thiscall
ON_CurveArray::GetTightBoundingBox
          (ON_CurveArray *this,ON_BoundingBox *tight_bbox,bool bGrowBox,ON_Xform *xform)

{
  ON_Curve *pOVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  ON_3dPointArray P;
  ON_3dPoint local_48;
  
  if (((this->super_ON_SimpleArray<ON_Curve_*>).m_count == 1) &&
     (pOVar1 = *(this->super_ON_SimpleArray<ON_Curve_*>).m_a, pOVar1 != (ON_Curve *)0x0)) {
    iVar4 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1a])
                      (pOVar1,tight_bbox,bGrowBox,xform);
    return SUB41(iVar4,0);
  }
  if (bGrowBox) {
    bVar3 = ON_BoundingBox::IsValid(tight_bbox);
    uVar6 = 1;
    if (bVar3) goto LAB_003fb521;
  }
  ON_BoundingBox::Destroy(tight_bbox);
  uVar6 = 0;
LAB_003fb521:
  bVar3 = SUB41(uVar6,0);
  iVar4 = (this->super_ON_SimpleArray<ON_Curve_*>).m_count;
  if (0 < iVar4) {
    ON_3dPointArray::ON_3dPointArray
              ((ON_3dPointArray *)&P.super_ON_SimpleArray<ON_3dPoint>,iVar4 * 2);
    for (lVar5 = 0; lVar5 < (this->super_ON_SimpleArray<ON_Curve_*>).m_count; lVar5 = lVar5 + 1) {
      pOVar1 = (this->super_ON_SimpleArray<ON_Curve_*>).m_a[lVar5];
      if (pOVar1 != (ON_Curve *)0x0) {
        ON_Curve::PointAtStart(&local_48,pOVar1);
        ON_SimpleArray<ON_3dPoint>::Append(&P.super_ON_SimpleArray<ON_3dPoint>,&local_48);
        ON_Curve::PointAtEnd(&local_48,(this->super_ON_SimpleArray<ON_Curve_*>).m_a[lVar5]);
        ON_SimpleArray<ON_3dPoint>::Append(&P.super_ON_SimpleArray<ON_3dPoint>,&local_48);
      }
    }
    bVar3 = ON_3dPointArray::GetTightBoundingBox(&P,tight_bbox,bVar3,xform);
    if (bVar3) {
      uVar6 = 1;
    }
    for (lVar5 = 0; bVar3 = SUB41(uVar6,0), lVar5 < (this->super_ON_SimpleArray<ON_Curve_*>).m_count
        ; lVar5 = lVar5 + 1) {
      pOVar1 = (this->super_ON_SimpleArray<ON_Curve_*>).m_a[lVar5];
      uVar2 = uVar6;
      if (pOVar1 != (ON_Curve *)0x0) {
        iVar4 = (*(pOVar1->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x1a])
                          (pOVar1,tight_bbox,(ulong)uVar6,xform);
        uVar2 = 1;
        if ((char)iVar4 == '\0') {
          uVar2 = uVar6;
        }
      }
      uVar6 = uVar2;
    }
    ON_SimpleArray<ON_3dPoint>::~ON_SimpleArray(&P.super_ON_SimpleArray<ON_3dPoint>);
  }
  return bVar3;
}

Assistant:

bool ON_CurveArray::GetTightBoundingBox( 
		ON_BoundingBox& tight_bbox, 
    bool bGrowBox,
		const ON_Xform* xform
    ) const
{
  if ( 1 == m_count && m_a[0] )
  {
    return m_a[0]->GetTightBoundingBox(tight_bbox,bGrowBox,xform);
  }

  if ( bGrowBox && !tight_bbox.IsValid() )
  {
    bGrowBox = false;
  }
  if ( !bGrowBox )
  {
    tight_bbox.Destroy();
  }

  if ( m_count > 0 )
  {
    int i;
    // getting box of endpoints tends to help us avoid testing curves
    ON_3dPointArray P(2*m_count);
    for ( i = 0; i < m_count; i++ )
    {
      if ( m_a[i] )
      {
        P.Append( m_a[i]->PointAtStart() );
        P.Append( m_a[i]->PointAtEnd() );
      }
    }
    if ( P.GetTightBoundingBox(tight_bbox,bGrowBox,xform) )
    {
      bGrowBox = true;
    }

    for ( i = 0; i < m_count; i++ )
    {
      if ( m_a[i] )
      {
        if ( m_a[i]->GetTightBoundingBox(tight_bbox,bGrowBox,xform) )
        {
          bGrowBox = true;
        }
      }
    }
  }

  return (0!=bGrowBox);  
}